

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O3

bool slang::ast::SFormat::parse
               (string_view str,
               function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> onText,
               function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
               onArg,function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)>
                     onError)

{
  byte *pbVar1;
  byte bVar2;
  optional<unsigned_int> oVar3;
  optional<unsigned_int> oVar4;
  undefined7 uVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  byte bVar9;
  byte *pbVar10;
  DiagCode DVar11;
  byte *pbVar12;
  size_t sVar13;
  slang *this;
  _Optional_payload_base<char> _Var14;
  int base;
  FormatOptions *pFVar15;
  byte *pbVar16;
  string_view str_00;
  string_view str_01;
  basic_string_view<char,_std::char_traits<char>_> bVar17;
  basic_string_view<char,_std::char_traits<char>_> bVar18;
  char c;
  size_t pos;
  SmallVector<char,_40UL> text;
  FormatOptions local_b8;
  char local_a0;
  undefined7 uStack_9f;
  intptr_t local_98;
  _func_void_intptr_t_basic_string_view<char,_std::char_traits<char>_> *local_90;
  _func_void_intptr_t_char_unsigned_long_unsigned_long_FormatOptions_ptr *local_88;
  intptr_t local_80;
  byte *local_78;
  SmallVectorBase<char> local_70 [2];
  
  local_80 = onArg.callable;
  pFVar15 = (FormatOptions *)onArg.callback;
  pbVar12 = (byte *)str._M_str;
  sVar13 = str._M_len;
  local_70[0].data_ = local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 0x28;
  bVar6 = true;
  local_88 = (_func_void_intptr_t_char_unsigned_long_unsigned_long_FormatOptions_ptr *)pFVar15;
  if (sVar13 != 0) {
    pbVar1 = pbVar12 + sVar13;
    local_78 = pbVar12 + (sVar13 - 1);
    pbVar10 = pbVar12;
    local_98 = onText.callable;
    local_90 = onText.callback;
    do {
      oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_base<unsigned_int,_true,_true>)local_b8.width;
      base = (int)pFVar15;
      pbVar16 = pbVar10 + 1;
      uVar5 = local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._1_7_;
      local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value._0_1_ = *pbVar10;
      oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_base<unsigned_int,_true,_true>)
           (_Optional_base<unsigned_int,_true,_true>)local_b8.width;
      if (*pbVar10 != 0x25) {
        SmallVectorBase<char>::emplace_back<char_const&>(local_70,(char *)&local_b8);
        pbVar10 = pbVar16;
        goto LAB_004312c3;
      }
      local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._5_3_ =
           oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._5_3_;
      local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value =
           oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      if (pbVar16 == pbVar1) {
        local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = false;
        local_b8.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = false;
        local_b8.leftJustify = false;
        local_b8.zeroPad = false;
LAB_004314e7:
        (*onError.callback)(onError.callable,(DiagCode)0x2f000b,(long)pbVar10 - (long)pbVar12,
                            (long)pbVar1 - (long)pbVar10,(optional<char>)0x0);
        local_a0 = '%';
        SmallVectorBase<char>::emplace_back<char>(local_70,&local_a0);
        break;
      }
      if (*pbVar16 == 0x25) {
        local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value._0_1_ = 0x25;
        local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_base<unsigned_int,_true,_true>)
             CONCAT71(uVar5,local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload
                            .super__Optional_payload_base<unsigned_int>._M_payload._0_1_);
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_b8);
        pbVar10 = pbVar10 + 2;
        goto LAB_004312c3;
      }
      bVar6 = false;
      local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged = false;
      local_b8.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged = false;
      local_b8.leftJustify = false;
      local_b8.zeroPad = false;
      this = (slang *)(local_78 + -(long)pbVar10);
      bVar8 = false;
      while (bVar2 = *pbVar16, bVar2 == 0x30) {
        if (bVar6) goto LAB_0043132b;
        local_b8.zeroPad = true;
        bVar6 = true;
LAB_00431313:
        pbVar16 = pbVar16 + 1;
        this = this + -1;
        if (pbVar16 == pbVar1) goto LAB_004314e7;
      }
      if (bVar2 == 0x2d) {
        if (!bVar8) {
          local_b8.leftJustify = true;
          bVar8 = true;
          goto LAB_00431313;
        }
      }
      else if ((byte)(bVar2 - 0x30) < 10) {
LAB_0043132b:
        str_00._M_str = &local_a0;
        str_00._M_len = (size_t)pbVar16;
        local_b8.width = strToUInt(this,str_00,(size_t *)0xa,base);
        pbVar16 = pbVar16 + (((long)local_b8.width.super__Optional_base<unsigned_int,_true,_true>.
                                    _M_payload.super__Optional_payload_base<unsigned_int> << 0x1f)
                             >> 0x3f & CONCAT71(uStack_9f,local_a0));
        if (((ulong)local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) goto LAB_00431591;
      }
      if (pbVar16 == pbVar1) goto LAB_004314e7;
      if (*pbVar16 == 0x2e) {
        pbVar16 = pbVar16 + 1;
        if ((pbVar16 == pbVar1) || (9 < (byte)(*pbVar16 - 0x30))) {
          if (local_b8.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged == false) {
            local_b8.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload =
                 (_Storage<unsigned_int,_true>)0x0;
            local_b8.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged = true;
          }
          local_b8.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> =
               (_Optional_base<unsigned_int,_true,_true>)
               ((ulong)local_b8.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int> & 0xffffffff00000000);
          goto LAB_004313d1;
        }
        str_01._M_str = &local_a0;
        str_01._M_len = (size_t)pbVar16;
        local_b8.precision = strToUInt((slang *)(pbVar1 + -(long)pbVar16),str_01,(size_t *)0xa,base)
        ;
        pbVar16 = pbVar16 + (((long)local_b8.precision.
                                    super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                    super__Optional_payload_base<unsigned_int> << 0x1f) >> 0x3f &
                            CONCAT71(uStack_9f,local_a0));
        if (((ulong)local_b8.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) goto LAB_004313d1;
LAB_00431591:
        (*onError.callback)(onError.callable,(DiagCode)0x13000b,(long)pbVar16 - (long)pbVar12,0,
                            (optional<char>)0x0);
        goto LAB_0043156c;
      }
LAB_004313d1:
      if (pbVar16 == pbVar1) goto LAB_004314e7;
      bVar2 = *pbVar16;
      pbVar16 = pbVar16 + 1;
      uVar7 = tolower((int)(char)bVar2);
      switch(uVar7 & 0xff) {
      case 0x62:
      case 100:
      case 0x68:
      case 0x6f:
      case 0x78:
        if (local_b8.zeroPad == true) {
          local_b8._16_2_ = local_b8._16_2_ & 0xff;
          if (local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged == false) {
            local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload =
                 (_Storage<unsigned_int,_true>)0x0;
            local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged = true;
          }
        }
        goto LAB_00431443;
      case 99:
      case 0x6c:
      case 0x6d:
      case 0x70:
      case 0x75:
      case 0x76:
      case 0x7a:
        bVar9 = 1;
        bVar6 = false;
        break;
      case 0x65:
      case 0x66:
      case 0x67:
        bVar6 = true;
        bVar9 = 0;
        break;
      default:
        _Var14 = (_Optional_payload_base<char>)(bVar2 | 0x100);
        DVar11.subsystem = SysFuncs;
        DVar11.code = 0x2a;
        goto LAB_0043154d;
      case 0x73:
      case 0x74:
LAB_00431443:
        bVar9 = 1;
        bVar6 = true;
      }
      if (local_b8.width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == false) {
        if (local_b8.leftJustify != true || bVar6) goto LAB_00431467;
LAB_00431533:
        _Var14 = (_Optional_payload_base<char>)(bVar2 | 0x100);
        DVar11.subsystem = SysFuncs;
        DVar11.code = 0x15;
LAB_0043154d:
        (*onError.callback)(onError.callable,DVar11,(long)pbVar10 - (long)pbVar12,
                            (long)pbVar16 - (long)pbVar10,(optional<char>)_Var14);
LAB_0043156c:
        bVar6 = false;
        goto LAB_0043156e;
      }
      if (!bVar6) goto LAB_00431533;
LAB_00431467:
      if ((local_b8.precision.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged & bVar9) != 0) {
        DVar11.subsystem = SysFuncs;
        DVar11.code = 0x14;
        _Var14._M_payload = (_Storage<char,_true>)0x0;
        _Var14._M_engaged = false;
        goto LAB_0043154d;
      }
      if ((!bVar6 && local_b8.zeroPad == true) && (char)uVar7 != 'p') goto LAB_00431533;
      if (local_70[0].len != 0) {
        bVar17._M_str = local_70[0].data_;
        bVar17._M_len = local_70[0].len;
        (*local_90)(local_98,bVar17);
        local_70[0].len = 0;
      }
      pFVar15 = &local_b8;
      (*local_88)(local_80,bVar2,(long)pbVar10 - (long)pbVar12,(long)pbVar16 - (long)pbVar10,
                  &local_b8);
      pbVar10 = pbVar16;
LAB_004312c3:
    } while (pbVar10 != pbVar1);
    if (local_70[0].len == 0) {
      bVar6 = true;
    }
    else {
      bVar18._M_str = local_70[0].data_;
      bVar18._M_len = local_70[0].len;
      (*local_90)(local_98,bVar18);
      bVar6 = true;
    }
  }
LAB_0043156e:
  if (local_70[0].data_ != local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return bVar6;
}

Assistant:

bool parse(std::string_view str, function_ref<void(std::string_view)> onText,
           function_ref<void(char, size_t, size_t, const FormatOptions&)> onArg,
           function_ref<void(DiagCode, size_t, size_t, std::optional<char>)> onError) {
    SmallVector<char> text;
    const char* ptr = str.data();
    const char* end = str.data() + str.length();

    auto err = [&](DiagCode code, const char* curr, std::optional<char> spec = {}) {
        onError(code, size_t(curr - str.data()), size_t(ptr - curr), spec);
    };

    while (ptr != end) {
        const char* start = ptr;
        if (char c = *ptr++; c != '%') {
            text.push_back(c);
            continue;
        }

        // %% collapses to a single %
        if (ptr != end && *ptr == '%') {
            ptr++;
            text.push_back('%');
            continue;
        }

        FormatOptions options;
        while (ptr != end) {
            if (*ptr == '-' && !options.leftJustify) {
                options.leftJustify = true;
                ptr++;
            }
            else if (*ptr == '0' && !options.zeroPad) {
                options.zeroPad = true;
                ptr++;
            }
            else {
                break;
            }
        }

        if (ptr != end && isDecimalDigit(*ptr)) {
            options.width = parseUInt(ptr, end);
            if (!options.width) {
                err(diag::FormatSpecifierInvalidWidth, ptr);
                return false;
            }
        }

        if (ptr != end && *ptr == '.') {
            ptr++;
            if (ptr != end && isDecimalDigit(*ptr)) {
                options.precision = parseUInt(ptr, end);
                if (!options.precision) {
                    err(diag::FormatSpecifierInvalidWidth, ptr);
                    return false;
                }
            }
            else {
                // Precision defaults to zero if we just have a decimal point.
                options.precision = 0;
            }
        }

        if (ptr == end) {
            err(diag::MissingFormatSpecifier, start);
            text.push_back('%');
            break;
        }

        bool widthAllowed = false;
        bool floatAllowed = false;
        char c = *ptr++;
        char spec = charToLower(c);
        switch (spec) {
            case 'h':
            case 'x':
            case 'd':
            case 'o':
            case 'b':
                widthAllowed = true;
                if (options.zeroPad) {
                    options.zeroPad = false;
                    if (!options.width)
                        options.width = 0;
                }
                break;
            case 'e':
            case 'f':
            case 'g':
                widthAllowed = true;
                floatAllowed = true;
                break;
            case 's':
            case 't':
                widthAllowed = true;
                break;
            case 'c':
            case 'u':
            case 'z':
            case 'v':
            case 'p':
            case 'l':
            case 'm':
                break;
            default:
                err(diag::UnknownFormatSpecifier, start, c);
                return false;
        }

        if ((options.width || options.leftJustify) && !widthAllowed) {
            err(diag::FormatSpecifierWidthNotAllowed, start, c);
            return false;
        }

        if (options.precision && !floatAllowed) {
            err(diag::FormatSpecifierNotFloat, start);
            return false;
        }

        // Pattern args allow the zero-pad specifier.
        if (options.zeroPad && !widthAllowed && spec != 'p') {
            err(diag::FormatSpecifierWidthNotAllowed, start, c);
            return false;
        }

        if (!text.empty()) {
            onText(toStringView(text));
            text.clear();
        }

        onArg(c, size_t(start - str.data()), size_t(ptr - start), options);
    }

    if (!text.empty())
        onText(toStringView(text));

    return true;
}